

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteStartArray(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                  *this)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  
  this_00 = &this->os_->stack_;
  if (this_00->stackEnd_ == this_00->stackTop_ ||
      (long)this_00->stackEnd_ - (long)this_00->stackTop_ < 0) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,1);
  }
  pcVar1 = this_00->stackTop_;
  this_00->stackTop_ = pcVar1 + 1;
  *pcVar1 = '[';
  return true;
}

Assistant:

bool WriteStartArray()  { os_->Put('['); return true; }